

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_alife_item_weapon::state_write(cse_alife_item_weapon *this,xr_packet *packet)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  xr_packet *packet_local;
  cse_alife_item_weapon *this_local;
  
  cse_alife_item::state_write(&this->super_cse_alife_item,packet);
  (*packet->_vptr_xr_packet[8])
            (packet,(ulong)this->m_ammo_current,extraout_RDX,this->m_ammo_current);
  uVar1 = this->m_ammo_elapsed;
  (*packet->_vptr_xr_packet[8])(packet,(ulong)uVar1,extraout_RDX_00,uVar1);
  uVar2 = CONCAT11((char)(uVar1 >> 8),this->m_state);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_state,extraout_RDX_01,uVar2);
  uVar2 = CONCAT11((char)((ushort)uVar2 >> 8),this->m_addon_flags);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_addon_flags,extraout_RDX_02,uVar2);
  uVar2 = CONCAT11((char)((ushort)uVar2 >> 8),this->m_ammo_type);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_ammo_type,extraout_RDX_03,uVar2);
  if (0x7a < (this->super_cse_alife_item).super_cse_alife_dynamic_object_visual.
             super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version) {
    (*packet->_vptr_xr_packet[10])
              (packet,(ulong)this->m_cs_unk1_u8,extraout_RDX_04,
               CONCAT11((char)((ushort)uVar2 >> 8),this->m_cs_unk1_u8));
  }
  return;
}

Assistant:

void cse_alife_item_weapon::state_write(xr_packet& packet)
{
	cse_alife_item::state_write(packet);
	packet.w_u16(m_ammo_current);
	packet.w_u16(m_ammo_elapsed);
	packet.w_u8(m_state);
	packet.w_u8(m_addon_flags);
	packet.w_u8(m_ammo_type);
	if (m_version > CSE_VERSION_0x7a)
		packet.w_u8(m_cs_unk1_u8);
}